

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v10::basic_format_parse_context<char>::do_check_arg_id
          (basic_format_parse_context<char> *this,int id)

{
  int id_local;
  basic_format_parse_context<char> *this_local;
  
  return;
}

Assistant:

FMT_CONSTEXPR void basic_format_parse_context<Char>::do_check_arg_id(int id) {
  // Argument id is only checked at compile-time during parsing because
  // formatting has its own validation.
  if (detail::is_constant_evaluated() &&
      (!FMT_GCC_VERSION || FMT_GCC_VERSION >= 1200)) {
    using context = detail::compile_parse_context<Char>;
    if (id >= static_cast<context*>(this)->num_args())
      detail::throw_format_error("argument not found");
  }
}